

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# temporary_file_manager.cpp
# Opt level: O3

void __thiscall
duckdb::TemporaryFileManager::EraseUsedBlock
          (TemporaryFileManager *this,TemporaryFileManagerLock *lock,block_id_t id,
          TemporaryFileHandle *handle,TemporaryFileIndex index)

{
  bool bVar1;
  iterator __it;
  idx_t val;
  TemporaryFileManagerLock *block_index;
  InternalException *this_00;
  block_id_t local_50;
  string local_48;
  
  local_50 = id;
  __it = ::std::
         _Hashtable<long,_std::pair<const_long,_duckdb::TemporaryFileIndex>,_std::allocator<std::pair<const_long,_duckdb::TemporaryFileIndex>_>,_std::__detail::_Select1st,_std::equal_to<long>,_std::hash<long>,_std::__detail::_Mod_range_hashing,_std::__detail::_Default_ranged_hash,_std::__detail::_Prime_rehash_policy,_std::__detail::_Hashtable_traits<false,_false,_true>_>
         ::find(&(this->used_blocks)._M_h,&local_50);
  if (__it.super__Node_iterator_base<std::pair<const_long,_duckdb::TemporaryFileIndex>,_false>.
      _M_cur != (__node_type *)0x0) {
    ::std::
    _Hashtable<long,_std::pair<const_long,_duckdb::TemporaryFileIndex>,_std::allocator<std::pair<const_long,_duckdb::TemporaryFileIndex>_>,_std::__detail::_Select1st,_std::equal_to<long>,_std::hash<long>,_std::__detail::_Mod_range_hashing,_std::__detail::_Default_ranged_hash,_std::__detail::_Prime_rehash_policy,_std::__detail::_Hashtable_traits<false,_false,_true>_>
    ::erase(&(this->used_blocks)._M_h,
            (const_iterator)
            __it.super__Node_iterator_base<std::pair<const_long,_duckdb::TemporaryFileIndex>,_false>
            ._M_cur);
    val = optional_idx::GetIndex(&index.block_index);
    block_index = (TemporaryFileManagerLock *)
                  NumericCastImpl<long,_unsigned_long,_false>::Convert(val);
    TemporaryFileHandle::EraseBlockIndex(handle,(block_id_t)block_index);
    bVar1 = TemporaryFileHandle::DeleteIfEmpty(handle);
    if (bVar1) {
      EraseFileHandle(this,block_index,&index.identifier);
    }
    return;
  }
  this_00 = (InternalException *)__cxa_allocate_exception(0x10);
  local_48._M_dataplus._M_p = (pointer)&local_48.field_2;
  ::std::__cxx11::string::_M_construct<char_const*>
            ((string *)&local_48,"EraseUsedBlock - Block %llu not found in used blocks","");
  InternalException::InternalException<long>(this_00,&local_48,local_50);
  __cxa_throw(this_00,&InternalException::typeinfo,::std::runtime_error::~runtime_error);
}

Assistant:

void TemporaryFileManager::EraseUsedBlock(TemporaryFileManagerLock &lock, block_id_t id, TemporaryFileHandle &handle,
                                          TemporaryFileIndex index) {
	auto entry = used_blocks.find(id);
	if (entry == used_blocks.end()) {
		throw InternalException("EraseUsedBlock - Block %llu not found in used blocks", id);
	}
	used_blocks.erase(entry);
	handle.EraseBlockIndex(NumericCast<block_id_t>(index.block_index.GetIndex()));
	if (handle.DeleteIfEmpty()) {
		EraseFileHandle(lock, index.identifier);
	}
}